

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_addColReal(SoPlexBase<double> *this,LPColReal *lpcol)

{
  bool bVar1;
  SPxStatus SVar2;
  SPxBasisBase<double> *this_00;
  LPColBase<double> *in_RSI;
  SoPlexBase<double> *in_RDI;
  Real RVar3;
  VarStatus *t;
  bool scale;
  VarStatus *in_stack_ffffffffffffffc8;
  SLUFactorRational *in_stack_ffffffffffffffd0;
  
  bVar1 = SPxLPBase<double>::isScaled(in_RDI->_realLP);
  (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[10])(in_RDI->_realLP,in_RSI,bVar1);
  if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
    if ((in_RDI->_hasBasis & 1U) != 0) {
      in_stack_ffffffffffffffd0 = (SLUFactorRational *)LPColBase<double>::lower(in_RSI);
      RVar3 = realParam(in_RDI,INFTY);
      if ((double)in_stack_ffffffffffffffd0 <= -RVar3) {
        t = (VarStatus *)LPColBase<double>::upper(in_RSI);
        RVar3 = realParam(in_RDI,INFTY);
        if (RVar3 <= (double)t) {
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
                    ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                     in_stack_ffffffffffffffd0,t);
        }
        else {
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
                    ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                     in_stack_ffffffffffffffd0,t);
        }
      }
      else {
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8);
      }
    }
  }
  else {
    this_00 = SPxSolverBase<double>::basis(&in_RDI->_solver);
    SVar2 = SPxBasisBase<double>::status(this_00);
    in_RDI->_hasBasis = NO_PROBLEM < SVar2;
  }
  SLUFactorRational::clear(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void SoPlexBase<R>::_addColReal(const LPColReal& lpcol)
{
   assert(_realLP != nullptr);

   bool scale = _realLP->isScaled();
   _realLP->addCol(lpcol, scale);

   if(_isRealLPLoaded)
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   else if(_hasBasis)
   {
      if(lpcol.lower() > -realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_LOWER);
      else if(lpcol.upper() < realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_UPPER);
      else
         _basisStatusCols.append(SPxSolverBase<R>::ZERO);
   }

   _rationalLUSolver.clear();
}